

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  double dVar2;
  double *pdVar3;
  ostream *poVar4;
  void *pvVar5;
  double dVar6;
  int local_4a8;
  allocator<char> local_4a1;
  int i_2;
  string filename;
  ofstream outputs_file;
  Mat local_280;
  undefined1 local_270 [8];
  RK4 Lat_Dyn_Integrate;
  undefined1 local_198 [8];
  RK4 Long_Dyn_Integrate;
  Mat ctrl_input_lat;
  int i_1;
  double ail_freq_rps;
  double ail_amplitude;
  undefined1 local_a0 [8];
  Mat ail_input;
  Mat ctrl_input_long;
  int i;
  double elev_freq_rps;
  double elev_amplitude;
  undefined1 local_60 [8];
  Mat elev_input;
  double local_40;
  undefined1 local_38 [8];
  Mat x0_lat;
  undefined1 local_20 [8];
  Mat x0_long;
  
  x0_long.v_._4_4_ = 0;
  x0_lat.v_ = (double *)0x0;
  Mat::Mat((Mat *)local_20,4,(double *)&x0_lat.v_);
  local_40 = 0.0;
  Mat::Mat((Mat *)local_38,5,&local_40);
  elev_amplitude = 0.0;
  Mat::Mat((Mat *)local_60,100,&elev_amplitude);
  for (ctrl_input_long.v_._4_4_ = 0; (double)ctrl_input_long.v_._4_4_ < t_sim / time_step;
      ctrl_input_long.v_._4_4_ = ctrl_input_long.v_._4_4_ + 1) {
    dVar6 = sin(time_step * 3.14159265 * (double)ctrl_input_long.v_._4_4_);
    pdVar3 = Mat::operator()((Mat *)local_60,ctrl_input_long.v_._4_4_);
    *pdVar3 = dVar6 * 0.0872664625;
  }
  Mat::Transpose((Mat *)&ail_input.v_);
  ail_amplitude = 0.0;
  Mat::Mat((Mat *)local_a0,100,&ail_amplitude);
  for (ctrl_input_lat.v_._4_4_ = 0; (double)ctrl_input_lat.v_._4_4_ < t_sim / time_step;
      ctrl_input_lat.v_._4_4_ = ctrl_input_lat.v_._4_4_ + 1) {
    dVar6 = sin(time_step * 3.14159265 * (double)ctrl_input_lat.v_._4_4_);
    pdVar3 = Mat::operator()((Mat *)local_a0,ctrl_input_lat.v_._4_4_);
    *pdVar3 = dVar6 * 0.0872664625;
  }
  Mat::Transpose((Mat *)&Long_Dyn_Integrate.k_4_.v_);
  dVar2 = t_init;
  iVar1 = n_eqs_long;
  dVar6 = t_sim;
  Mat::Mat((Mat *)&Lat_Dyn_Integrate.k_4_.v_,(Mat *)local_20);
  RK4::RK4((RK4 *)local_198,LongDynXdot,iVar1,dVar2,dVar6,(Mat *)&Lat_Dyn_Integrate.k_4_.v_,
           time_step,(Mat *)&ail_input.v_);
  Mat::~Mat((Mat *)&Lat_Dyn_Integrate.k_4_.v_);
  RK4::Integrate((RK4 *)local_198);
  poVar4 = std::operator<<((ostream *)&std::cout,"Long dynamics integration finished.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  dVar2 = t_init;
  iVar1 = n_eqs_lat;
  dVar6 = t_sim;
  Mat::Mat(&local_280,(Mat *)local_38);
  RK4::RK4((RK4 *)local_270,LatDynXdot,iVar1,dVar2,dVar6,&local_280,time_step,
           (Mat *)&Long_Dyn_Integrate.k_4_.v_);
  Mat::~Mat(&local_280);
  RK4::Integrate((RK4 *)local_270);
  poVar4 = std::operator<<((ostream *)&std::cout,"Lat dynamics integration finished.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Final long state is: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Mat::Print((Mat *)&Long_Dyn_Integrate.n_fails_,"Output");
  poVar4 = std::operator<<((ostream *)&std::cout,"Final lat state is: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Mat::Print((Mat *)&Lat_Dyn_Integrate.n_fails_,"Output");
  std::ofstream::ofstream((void *)((long)&filename.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_2,"sim_out.csv",&local_4a1);
  std::allocator<char>::~allocator(&local_4a1);
  std::ofstream::open((undefined1 *)((long)&filename.field_2 + 8),&i_2,0x10);
  poVar4 = std::operator<<((ostream *)(filename.field_2._M_local_buf + 8),"time");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"u_mps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"w_mps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"q_dps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"theta_deg");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"v");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"p_dps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"r_dps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"phi_deg");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"psi_deg");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_4a8 = 0; (double)local_4a8 <= t_sim / time_step; local_4a8 = local_4a8 + 1) {
    if (local_4a8 == 0) {
      poVar4 = (ostream *)std::ostream::operator<<((void *)((long)&filename.field_2 + 8),0.0);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_20,0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_20,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_20,2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_20,3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_38,0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_38,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_38,2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_38,3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)local_38,4);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,*pdVar3);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((void *)((long)&filename.field_2 + 8),time_step * (double)local_4a8);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Long_Dyn_Integrate.y_out_.v_,0,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Long_Dyn_Integrate.y_out_.v_,1,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Long_Dyn_Integrate.y_out_.v_,2,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Long_Dyn_Integrate.y_out_.v_,3,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Lat_Dyn_Integrate.y_out_.v_,0,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar3);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Lat_Dyn_Integrate.y_out_.v_,1,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Lat_Dyn_Integrate.y_out_.v_,2,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Lat_Dyn_Integrate.y_out_.v_,3,local_4a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      poVar4 = std::operator<<(poVar4,",");
      pdVar3 = Mat::operator()((Mat *)&Lat_Dyn_Integrate.y_out_.v_,4,local_4a8);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,(*pdVar3 * 180.0) / 3.14159265);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  x0_long.v_._4_4_ = 0;
  std::__cxx11::string::~string((string *)&i_2);
  std::ofstream::~ofstream((void *)((long)&filename.field_2 + 8));
  RK4::~RK4((RK4 *)local_270);
  RK4::~RK4((RK4 *)local_198);
  Mat::~Mat((Mat *)&Long_Dyn_Integrate.k_4_.v_);
  Mat::~Mat((Mat *)local_a0);
  Mat::~Mat((Mat *)&ail_input.v_);
  Mat::~Mat((Mat *)local_60);
  Mat::~Mat((Mat *)local_38);
  Mat::~Mat((Mat *)local_20);
  return x0_long.v_._4_4_;
}

Assistant:

int main()
{   
    // Define initial state
    Mat x0_long(4, 0.0);
    Mat x0_lat(5, 0.0);

    // Define the control inputs
    Mat elev_input(100, 0.0);
    double elev_amplitude = 5 * PI / 180;
    double elev_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        elev_input(i) = elev_amplitude * sin(elev_freq_rps * time_step * i);
    }
    Mat ctrl_input_long = elev_input.Transpose();

    Mat ail_input(100, 0.0);
    double ail_amplitude = 5 * PI / 180;
    double ail_freq_rps = PI;
    for (int i = 0; i < t_sim/time_step; i++) {
        ail_input(i) = ail_amplitude * sin(ail_freq_rps * time_step * i);
    }
    Mat ctrl_input_lat = ail_input.Transpose();

    // Perform numerical integration
    RK4 Long_Dyn_Integrate(LongDynXdot, n_eqs_long, t_init, t_sim, x0_long, time_step, ctrl_input_long);
    Long_Dyn_Integrate.Integrate();
    std::cout << "Long dynamics integration finished." << std::endl;

    RK4 Lat_Dyn_Integrate(LatDynXdot, n_eqs_lat, t_init, t_sim, x0_lat, time_step, ctrl_input_lat);
    Lat_Dyn_Integrate.Integrate();
    std::cout << "Lat dynamics integration finished." << std::endl;

    // Display results
    std::cout << "Final long state is: " << std::endl;
    Long_Dyn_Integrate.y_out_.Print("Output");

    std::cout << "Final lat state is: " << std::endl;
    Lat_Dyn_Integrate.y_out_.Print("Output");

    // Create a csv file and save output data
    std::ofstream outputs_file;
    std::string filename = "sim_out.csv";
    outputs_file.open(filename);
    outputs_file << "time" << "," << "u_mps" << "," << "w_mps" << "," 
                 << "q_dps" << "," << "theta_deg" << ","
                 << "v" << "," << "p_dps" << "," << "r_dps" << ","
                 << "phi_deg" << "," << "psi_deg" << std::endl;
    for (int i = 0; i <= t_sim/time_step; i++) {
        if (i == 0) {
            outputs_file << 0.0 << "," << x0_long(0) << "," << x0_long(1) << "," 
                         << x0_long(2) << "," << x0_long(3) << ","
                         << x0_lat(0) << "," << x0_lat(1) << "," << x0_lat(2) << ","
                         << x0_lat(3) << "," << x0_lat(4) << std::endl;
        } else {
            outputs_file << time_step * i << "," 
                         << Long_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(1, i) << ","
                         << Long_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Long_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(0, i) << ","
                         << Lat_Dyn_Integrate.Y_Out_(1, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(2, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(3, i) * 180.0 / PI << ","
                         << Lat_Dyn_Integrate.Y_Out_(4, i) * 180.0 / PI << std::endl;
        }
        
    }

    // Close the output csv file
    outputs_file.close();
    
    return 0; 
}